

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O1

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::TriangleMv<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::TriangleMv<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FastAllocator *this_00;
  ThreadLocal *pTVar9;
  ThreadLocal2 *this_01;
  iterator __position;
  TriangleMesh *pTVar10;
  BuildPrim *pBVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  size_t sVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vuint4 vgeomID;
  vuint4 vprimID;
  ulong local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  CreateMortonLeaf<4,_embree::TriangleMv<4>_> *local_50;
  uint local_48 [6];
  
  uVar6 = current->_begin;
  uVar7 = current->_end;
  this_00 = alloc->alloc;
  pTVar9 = alloc->talloc1;
  local_f8 = 0xb0;
  this_01 = pTVar9->parent;
  local_50 = this;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_b8[8] = 1;
    local_b8._0_8_ = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_88._0_8_ = this_01;
    local_e8[8] = 1;
    local_e8._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)local_88);
    }
    else {
      *__position._M_current = (ThreadLocal2 *)local_88._0_8_;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_e8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_e8._0_8_);
    }
    if (local_b8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_b8._0_8_);
    }
  }
  pTVar9->bytesUsed = pTVar9->bytesUsed + local_f8;
  sVar17 = pTVar9->cur;
  uVar19 = (ulong)(-(int)sVar17 & 0xf);
  uVar15 = sVar17 + local_f8 + uVar19;
  pTVar9->cur = uVar15;
  if (pTVar9->end < uVar15) {
    pTVar9->cur = sVar17;
    if (pTVar9->allocBlockSize < local_f8 << 2) {
      pcVar16 = (char *)FastAllocator::malloc(this_00,(size_t)&local_f8);
    }
    else {
      local_e8._0_8_ = pTVar9->allocBlockSize;
      pcVar16 = (char *)FastAllocator::malloc(this_00,(size_t)local_e8);
      pTVar9->ptr = pcVar16;
      sVar17 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
      pTVar9->bytesWasted = sVar17;
      pTVar9->cur = 0;
      pTVar9->end = local_e8._0_8_;
      pTVar9->cur = local_f8;
      if ((ulong)local_e8._0_8_ < local_f8) {
        pTVar9->cur = 0;
        local_e8._0_8_ = pTVar9->allocBlockSize;
        pcVar16 = (char *)FastAllocator::malloc(this_00,(size_t)local_e8);
        pTVar9->ptr = pcVar16;
        sVar17 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
        pTVar9->bytesWasted = sVar17;
        pTVar9->cur = 0;
        pTVar9->end = local_e8._0_8_;
        pTVar9->cur = local_f8;
        if ((ulong)local_e8._0_8_ < local_f8) {
          pTVar9->cur = 0;
          pcVar16 = (char *)0x0;
          goto LAB_00cc441b;
        }
      }
      pTVar9->bytesWasted = sVar17;
    }
  }
  else {
    pTVar9->bytesWasted = pTVar9->bytesWasted + uVar19;
    pcVar16 = pTVar9->ptr + (uVar15 - local_f8);
  }
LAB_00cc441b:
  local_f8 = 0xffffffffffffffff;
  uStack_f0 = 0xffffffff;
  uStack_ec = 0xffffffff;
  local_48[0] = 0xffffffff;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  if (uVar7 == uVar6) {
    auVar23 = DAT_01feb9f0._0_12_;
    aVar22 = _DAT_01feba00;
  }
  else {
    iVar18 = uVar7 - uVar6;
    pTVar10 = local_50->mesh;
    pBVar11 = local_50->morton;
    lVar12 = *(long *)&(pTVar10->super_Geometry).field_0x58;
    lVar13 = *(long *)&pTVar10->field_0x68;
    pcVar14 = (pTVar10->vertices0).super_RawBufferView.ptr_ofs;
    sVar17 = (pTVar10->vertices0).super_RawBufferView.stride;
    uVar7 = local_50->geomID_;
    lVar20 = 0;
    aVar22 = _DAT_01feba00;
    auVar24 = _DAT_01feb9f0;
    do {
      uVar8 = *(uint *)((long)&pBVar11[uVar6].field_0 + lVar20 * 2 + 4);
      lVar21 = (ulong)uVar8 * lVar13;
      auVar3 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar12 + lVar21) * sVar17);
      auVar4 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar12 + 4 + lVar21) * sVar17);
      auVar5 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar12 + 8 + lVar21) * sVar17);
      auVar24 = minps(auVar24,auVar3);
      auVar26 = minps(auVar4,auVar5);
      auVar24 = minps(auVar24,auVar26);
      auVar23 = auVar24._0_12_;
      auVar26 = maxps((undefined1  [16])aVar22,auVar3);
      auVar27 = maxps(auVar4,auVar5);
      aVar22 = (anon_union_16_2_47237d3f_for_Vec3fx_0)maxps(auVar26,auVar27);
      *(uint *)((long)&local_f8 + lVar20) = uVar7;
      *(uint *)((long)local_48 + lVar20) = uVar8;
      *(int *)(local_e8 + lVar20) = auVar3._0_4_;
      *(int *)(local_d8 + lVar20) = auVar3._4_4_;
      *(int *)(local_c8 + lVar20) = auVar3._8_4_;
      *(int *)(local_b8 + lVar20) = auVar4._0_4_;
      *(int *)(local_a8 + lVar20) = auVar4._4_4_;
      *(int *)(local_98 + lVar20) = auVar4._8_4_;
      *(int *)(local_88 + lVar20) = auVar5._0_4_;
      *(int *)(local_78 + lVar20) = auVar5._4_4_;
      *(int *)(local_68 + lVar20) = auVar5._8_4_;
      lVar20 = lVar20 + 4;
    } while ((ulong)(iVar18 + (uint)(iVar18 == 0)) << 2 != lVar20);
  }
  *(undefined8 *)pcVar16 = local_e8._0_8_;
  *(undefined8 *)(pcVar16 + 8) = local_e8._8_8_;
  *(undefined8 *)(pcVar16 + 0x10) = local_d8._0_8_;
  *(undefined8 *)(pcVar16 + 0x18) = local_d8._8_8_;
  *(undefined8 *)(pcVar16 + 0x20) = local_c8._0_8_;
  *(undefined8 *)(pcVar16 + 0x28) = local_c8._8_8_;
  *(undefined8 *)(pcVar16 + 0x30) = local_b8._0_8_;
  *(undefined8 *)(pcVar16 + 0x38) = local_b8._8_8_;
  *(undefined8 *)(pcVar16 + 0x40) = local_a8._0_8_;
  *(undefined8 *)(pcVar16 + 0x48) = local_a8._8_8_;
  *(undefined8 *)(pcVar16 + 0x50) = local_98._0_8_;
  *(undefined8 *)(pcVar16 + 0x58) = local_98._8_8_;
  *(undefined8 *)(pcVar16 + 0x60) = local_88._0_8_;
  *(undefined8 *)(pcVar16 + 0x68) = local_88._8_8_;
  *(undefined8 *)(pcVar16 + 0x70) = local_78._0_8_;
  *(undefined8 *)(pcVar16 + 0x78) = local_78._8_8_;
  *(undefined8 *)(pcVar16 + 0x80) = local_68._0_8_;
  *(undefined8 *)(pcVar16 + 0x88) = local_68._8_8_;
  *(ulong *)(pcVar16 + 0x90) = local_f8;
  *(ulong *)(pcVar16 + 0x98) = CONCAT44(uStack_ec,uStack_f0);
  *(ulong *)(pcVar16 + 0xa0) = CONCAT44(local_48[1],local_48[0]);
  *(ulong *)(pcVar16 + 0xa8) = CONCAT44(local_48[3],local_48[2]);
  aVar25.m128[3] = (float)(current->_end - current->_begin);
  aVar25._0_12_ = auVar23;
  (__return_storage_ptr__->ref).ptr = (ulong)pcVar16 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar25;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar22;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4v* accel = (Triangle4v*) alloc.malloc1(sizeof(Triangle4v),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);       
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero;
        const TriangleMesh* __restrict__ mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
        }
        Triangle4v::store_nt(accel,Triangle4v(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }